

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O2

int tjDestroy(tjhandle handle)

{
  int iVar1;
  uint uVar2;
  tjinstance *this;
  long in_FS_OFFSET;
  
  if (handle != (tjhandle)0x0) {
    *(undefined4 *)((long)handle + 0x5f8) = 0;
    *(undefined4 *)((long)handle + 0x6d0) = 0;
    iVar1 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
    if (iVar1 == 0) {
      uVar2 = *(uint *)((long)handle + 0x600);
      if ((uVar2 & 1) != 0) {
        jpeg_destroy_compress((j_compress_ptr)handle);
        uVar2 = *(uint *)((long)handle + 0x600);
      }
      if ((uVar2 & 2) != 0) {
        jpeg_destroy_decompress((j_decompress_ptr)((long)handle + 0x208));
      }
      free(handle);
      iVar1 = 0;
    }
    else {
      iVar1 = -1;
    }
    return iVar1;
  }
  *(undefined8 *)(in_FS_OFFSET + -0xc9) = 0x656c646e616820;
  *(undefined8 *)(in_FS_OFFSET + -0xd0) = 0x2064696c61766e49;
  return -1;
}

Assistant:

DLLEXPORT int tjDestroy(tjhandle handle)
{
  GET_INSTANCE(handle);

  if (setjmp(this->jerr.setjmp_buffer)) return -1;
  if (this->init & COMPRESS) jpeg_destroy_compress(cinfo);
  if (this->init & DECOMPRESS) jpeg_destroy_decompress(dinfo);
  free(this);
  return 0;
}